

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

Node * mainposition(Table *t,TValue *key)

{
  ushort uVar1;
  Node *pNVar2;
  uint uVar3;
  ushort uVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  int local_1c;
  
  uVar1 = key->tt_;
  uVar4 = uVar1 & 0x7f;
  if (uVar4 < 0x13) {
    switch(uVar4) {
    case 1:
      if (uVar1 != 1) {
        __assert_fail("((((key))->tt_) == (1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x70,"Node *mainposition(const Table *, const TValue *)");
      }
      uVar6 = (ulong)(t->hmask & (key->value_).b);
      goto LAB_0013bda3;
    case 2:
      if (uVar1 != 2) {
        __assert_fail("((((key))->tt_) == (2))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x72,"Node *mainposition(const Table *, const TValue *)");
      }
      goto LAB_0013bd94;
    case 3:
      if (uVar1 != 3) {
        __assert_fail("((((key))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x6a,"Node *mainposition(const Table *, const TValue *)");
      }
      pNVar2 = t->node;
      dVar7 = frexp((key->value_).n,&local_1c);
      dVar7 = dVar7 * 2147483648.0;
      if ((dVar7 < -9.223372036854776e+18) || (9.223372036854776e+18 <= dVar7)) {
        uVar3 = 0;
        if ((long)ABS(dVar7) < 0x7ff0000000000000) {
          __assert_fail("(!(((n))==((n)))) || fabs(n) == ((lua_Number)(((__builtin_huge_val ()))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x56,"int l_hashfloat(lua_Number)");
        }
      }
      else {
        uVar3 = (int)(long)dVar7 + local_1c;
        uVar3 = (int)uVar3 >> 0x1f ^ uVar3;
      }
      return pNVar2 + (ulong)uVar3 % (ulong)(t->hmask | 1);
    case 4:
      if ((uVar1 & 0xf) == 4) {
        if ((((key->value_).gc)->tt & 0xf) == 4) {
          uVar6 = (ulong)(t->hmask & *(uint *)&((key->value_).gc)->field_0xc);
          goto LAB_0013bda3;
        }
        pcVar5 = "(((((key)->value_).gc)->tt) & 0x0F) == 4";
      }
      else {
        pcVar5 = "(((((((key))->tt_)) & 0x0F)) == (4))";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x6c,"Node *mainposition(const Table *, const TValue *)");
    }
switchD_0013bc3c_default:
    if (uVar1 == 10) {
      __assert_fail("!((((key))->tt_) == ((9+1)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x78,"Node *mainposition(const Table *, const TValue *)");
    }
    if (-1 < (short)uVar1) {
      __assert_fail("(((key)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x79,"Node *mainposition(const Table *, const TValue *)");
    }
  }
  else {
    if (uVar4 < 0x16) {
      if (uVar4 == 0x13) {
        if (uVar1 != 0x13) {
          __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x68,"Node *mainposition(const Table *, const TValue *)");
        }
        uVar6 = (ulong)((key->value_).b & t->hmask);
        goto LAB_0013bda3;
      }
      if (uVar4 == 0x14) {
        if ((uVar1 & 0xf) == 4) {
          if ((((TString *)(key->value_).gc)->tt & 0xf) == 4) {
            pNVar2 = t->node;
            uVar3 = luaS_hashlongstr((TString *)(key->value_).gc);
            return pNVar2 + (uVar3 & t->hmask);
          }
          pcVar5 = "(((((key)->value_).gc)->tt) & 0x0F) == 4";
        }
        else {
          pcVar5 = "(((((((key))->tt_)) & 0x0F)) == (4))";
        }
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x6e,"Node *mainposition(const Table *, const TValue *)");
      }
      goto switchD_0013bc3c_default;
    }
    if (uVar4 == 0x16) {
      if (uVar1 != 0x16) {
        __assert_fail("((((key))->tt_) == (((6) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x74,"Node *mainposition(const Table *, const TValue *)");
      }
    }
    else if (uVar4 != 0x46) goto switchD_0013bc3c_default;
  }
LAB_0013bd94:
  uVar6 = (ulong)(uint)(key->value_).b % (ulong)(t->hmask | 1);
LAB_0013bda3:
  return t->node + uVar6;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMINT:
      return hashint(t, ivalue(key));
    case LUA_TNUMFLT:
      return hashmod(t, l_hashfloat(fltvalue(key)));
    case LUA_TSHRSTR:
      return hashstr(t, tsvalue(key));
    case LUA_TLNGSTR:
      return hashpow2(t, luaS_hashlongstr(tsvalue(key)));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    case RAVI_TFCF:
      return hashpointer(t, fcfvalue(key));
    default:
      lua_assert(!ttisdeadkey(key));
      return hashpointer(t, gcvalue(key));
  }
}